

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O3

void __thiscall QFrame::changeEvent(QFrame *this,QEvent *ev)

{
  if (*(short *)(ev + 8) == 100) {
    QFramePrivate::updateFrameWidth(*(QFramePrivate **)&(this->super_QWidget).field_0x8);
  }
  QWidget::changeEvent(&this->super_QWidget,ev);
  return;
}

Assistant:

void QFrame::changeEvent(QEvent *ev)
{
    Q_D(QFrame);
    if (ev->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || ev->type() == QEvent::MacSizeChange
#endif
            )
        d->updateFrameWidth();
    QWidget::changeEvent(ev);
}